

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

bool kj::_::pollImpl(PromiseNode *node,WaitScope *waitScope,SourceLocation location)

{
  EventLoop *this;
  FiberPool *this_00;
  EventPort *pEVar1;
  bool bVar2;
  byte bVar3;
  undefined **ppuVar4;
  nfds_t __nfds;
  Exception *__fds;
  long *in_FS_OFFSET;
  FunctionParam<void_()> func;
  Fault f;
  DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> _kjCondition;
  
  this = waitScope->loop;
  _kjCondition.right = (EventLoop **)(*in_FS_OFFSET + -0x28);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = this == (EventLoop *)in_FS_OFFSET[-5];
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    _kjCondition.left = this;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81a,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",&_kjCondition,
               (char (*) [37])"WaitScope not valid for this thread.");
    Debug::Fault::fatal(&f);
  }
  _kjCondition.left = (EventLoop *)&waitScope->fiber;
  _kjCondition.result = (waitScope->fiber).ptr == (FiberBase *)0x0;
  _kjCondition.right = (EventLoop **)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81b,FAILED,"waitScope.fiber == kj::none",
               "_kjCondition,\"poll() is not supported in fibers.\"",
               (DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)&_kjCondition,
               (char (*) [35])"poll() is not supported in fibers.");
    Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)(CONCAT71(f.exception._1_7_,this->running) ^ 1);
  if (this->running != false) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81c,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)&f,
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition.right = (EventLoop **)anon_unknown_173::currentEventLoop();
  _kjCondition.op.content.ptr = (char *)0x0;
  _kjCondition.op.content.size_ = 0;
  _kjCondition.result = false;
  _kjCondition._36_4_ = 0x1e366381;
  ppuVar4 = &PTR_traceEvent_00620610;
  _kjCondition.left = (EventLoop *)&PTR_traceEvent_00620610;
  __fds = (Exception *)&_kjCondition;
  (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node);
  this->running = true;
  this_00 = (waitScope->runningStacksPool).ptr;
  f.exception = (Exception *)&_kjCondition;
  if (this_00 == (FiberPool *)0x0) {
    do {
      bVar2 = EventLoop::turn(this);
      if (bVar2) {
        bVar3 = *(byte *)&((f.exception)->context).ptr.disposer;
      }
      else {
        EventLoop::poll(this,(pollfd *)__fds,__nfds,(int)ppuVar4);
        bVar3 = *(byte *)&((f.exception)->context).ptr.disposer;
        if ((bVar3 == 0) && (this->head == (Event *)0x0)) {
          (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node,0);
          if (this->lastRunnableState != false) {
            pEVar1 = (this->port).ptr;
            if (pEVar1 != (EventPort *)0x0) {
              (*pEVar1->_vptr_EventPort[2])(pEVar1,0);
            }
            this->lastRunnableState = false;
          }
          break;
        }
      }
    } while ((bVar3 & 1) == 0);
  }
  else {
    func.space._8_8_ = &f;
    func.space._0_8_ = &PTR_operator___006208a0;
    FiberPool::runSynchronously(this_00,func);
  }
  this->running = false;
  Event::~Event((Event *)&_kjCondition);
  return false;
}

Assistant:

bool pollImpl(_::PromiseNode& node, WaitScope& waitScope, SourceLocation location) {
  EventLoop& loop = waitScope.loop;
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(waitScope.fiber == kj::none, "poll() is not supported in fibers.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  RootEvent doneEvent(&node, reinterpret_cast<void*>(&pollImpl), location);
  node.onReady(&doneEvent);

  loop.running = true;
  KJ_DEFER(loop.running = false);

  waitScope.runOnStackPool([&]() {
    while (!doneEvent.fired) {
      if (!loop.turn()) {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!doneEvent.fired && !loop.isRunnable()) {
          // No progress. Give up.
          node.onReady(nullptr);
          loop.setRunnable(false);
          break;
        }
      }
    }
  });

  if (!doneEvent.fired) {
    return false;
  }

  loop.setRunnable(loop.isRunnable());
  return true;
}